

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O3

void base_shift_left(cpu_registers *registers,uint8_t *value_to_shift)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar3 = *value_to_shift;
  *value_to_shift = bVar3 * '\x02';
  bVar1 = registers->flags;
  bVar3 = bVar3 >> 7;
  registers->flags = bVar3 | bVar1 & 0xfe;
  bVar2 = (*value_to_shift == '\0') * '\x02';
  registers->flags = bVar2 | bVar3 | bVar1 & 0xfc;
  registers->flags = *value_to_shift & 0x80 | bVar2 | bVar3 | bVar1 & 0x7c;
  return;
}

Assistant:

void base_shift_left(cpu_registers* registers, uint8_t* value_to_shift) {
    const uint16_t carry_bit_position = 0x100;
    uint16_t result = *value_to_shift << 1;
    *value_to_shift = result & BYTE_MASK;

    if(result & carry_bit_position) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    determine_zero_flag(registers, *value_to_shift);
    determine_negative_flag(registers, *value_to_shift);
}